

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductDefinitionShape::~IfcProductDefinitionShape
          (IfcProductDefinitionShape *this)

{
  ~IfcProductDefinitionShape
            ((IfcProductDefinitionShape *)
             ((long)&(this->super_IfcProductRepresentation).
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcProductRepresentation).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcProductDefinitionShape() : Object("IfcProductDefinitionShape") {}